

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O1

void __thiscall Fl_Group::resize(Fl_Group *this,int X,int Y,int W,int H)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Fl_Widget *pFVar7;
  int iVar8;
  int *piVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  Fl_Widget ***pppFVar17;
  int iVar18;
  long lVar19;
  
  iVar1 = (this->super_Fl_Widget).x_;
  iVar2 = (this->super_Fl_Widget).y_;
  iVar10 = (this->super_Fl_Widget).w_;
  iVar8 = (this->super_Fl_Widget).h_;
  piVar9 = sizes(this);
  Fl_Widget::resize(&this->super_Fl_Widget,X,Y,W,H);
  if ((this->resizable_ == (Fl_Widget *)0x0) || ((iVar10 == W && (iVar8 == H)))) {
    if (((this->super_Fl_Widget).type_ < 0xf0) && (iVar10 = this->children_, iVar10 != 0)) {
      if (iVar10 < 2) {
        pppFVar17 = &this->array_;
      }
      else {
        pppFVar17 = (Fl_Widget ***)this->array_;
      }
      lVar19 = 0;
      do {
        pFVar7 = (Fl_Widget *)pppFVar17[lVar19];
        (*pFVar7->_vptr_Fl_Widget[4])
                  (pFVar7,(ulong)(uint)(pFVar7->x_ + (X - iVar1)),
                   (ulong)(uint)(pFVar7->y_ + (Y - iVar2)),(ulong)(uint)pFVar7->w_,
                   (ulong)(uint)pFVar7->h_);
        lVar19 = lVar19 + 1;
      } while (iVar10 != (int)lVar19);
    }
  }
  else {
    iVar1 = this->children_;
    if (iVar1 != 0) {
      iVar8 = (*piVar9 - piVar9[1]) + W;
      iVar13 = (piVar9[2] - piVar9[3]) + H;
      lVar19 = 0;
      iVar10 = X - *piVar9;
      iVar2 = Y - piVar9[2];
      if (0xef < (this->super_Fl_Widget).type_) {
        iVar10 = 0;
        iVar2 = 0;
      }
      iVar3 = piVar9[4];
      iVar4 = piVar9[5];
      iVar5 = piVar9[6];
      iVar6 = piVar9[7];
      if (iVar1 < 2) {
        pppFVar17 = &this->array_;
      }
      else {
        pppFVar17 = (Fl_Widget ***)this->array_;
      }
      piVar9 = piVar9 + 8;
      iVar14 = iVar4 - iVar3;
      iVar11 = iVar6 - iVar5;
      do {
        iVar15 = *piVar9;
        if (iVar15 < iVar4) {
          if (iVar15 - iVar3 != 0 && iVar3 <= iVar15) {
            iVar15 = ((iVar15 - iVar3) * ((iVar8 - iVar3) + iVar4) + iVar14 / 2) / iVar14 + iVar3;
          }
        }
        else {
          iVar15 = iVar15 + iVar8;
        }
        iVar12 = piVar9[1];
        if (iVar12 < iVar4) {
          if (iVar12 - iVar3 != 0 && iVar3 <= iVar12) {
            iVar12 = ((iVar12 - iVar3) * ((iVar8 + iVar4) - iVar3) + iVar14 / 2) / iVar14 + iVar3;
          }
        }
        else {
          iVar12 = iVar12 + iVar8;
        }
        iVar18 = piVar9[2];
        if (iVar18 < iVar6) {
          if (iVar18 - iVar5 != 0 && iVar5 <= iVar18) {
            iVar18 = ((iVar18 - iVar5) * ((iVar13 - iVar5) + iVar6) + iVar11 / 2) / iVar11 + iVar5;
          }
        }
        else {
          iVar18 = iVar18 + iVar13;
        }
        iVar16 = piVar9[3];
        if (iVar16 < iVar6) {
          if (iVar16 - iVar5 != 0 && iVar5 <= iVar16) {
            iVar16 = ((iVar16 - iVar5) * ((iVar13 + iVar6) - iVar5) + iVar11 / 2) / iVar11 + iVar5;
          }
        }
        else {
          iVar16 = iVar16 + iVar13;
        }
        (*((Fl_Widget *)pppFVar17[lVar19])->_vptr_Fl_Widget[4])
                  ((Fl_Widget *)pppFVar17[lVar19],(ulong)(uint)(iVar15 + iVar10),
                   (ulong)(uint)(iVar18 + iVar2),(ulong)(uint)(iVar12 - iVar15),
                   (ulong)(uint)(iVar16 - iVar18));
        lVar19 = lVar19 + 1;
        piVar9 = piVar9 + 4;
      } while (iVar1 != (int)lVar19);
    }
  }
  return;
}

Assistant:

void Fl_Group::resize(int X, int Y, int W, int H) {

  int dx = X-x();
  int dy = Y-y();
  int dw = W-w();
  int dh = H-h();
  
  int *p = sizes(); // save initial sizes and positions

  Fl_Widget::resize(X,Y,W,H); // make new xywh values visible for children

  if (!resizable() || (dw==0 && dh==0) ) {

    if (type() < FL_WINDOW) {
      Fl_Widget*const* a = array();
      for (int i=children_; i--;) {
	Fl_Widget* o = *a++;
	o->resize(o->x()+dx, o->y()+dy, o->w(), o->h());
      }
    }

  } else if (children_) {

    // get changes in size/position from the initial size:
    dx = X - p[0];
    dw = W - (p[1]-p[0]);
    dy = Y - p[2];
    dh = H - (p[3]-p[2]);
    if (type() >= FL_WINDOW) dx = dy = 0;
    p += 4;

    // get initial size of resizable():
    int IX = *p++;
    int IR = *p++;
    int IY = *p++;
    int IB = *p++;

    Fl_Widget*const* a = array();
    for (int i=children_; i--;) {
      Fl_Widget* o = *a++;
#if 1
      int XX = *p++;
      if (XX >= IR) XX += dw;
      else if (XX > IX) XX = IX+((XX-IX)*(IR+dw-IX)+(IR-IX)/2)/(IR-IX);
      int R = *p++;
      if (R >= IR) R += dw;
      else if (R > IX) R = IX+((R-IX)*(IR+dw-IX)+(IR-IX)/2)/(IR-IX);

      int YY = *p++;
      if (YY >= IB) YY += dh;
      else if (YY > IY) YY = IY+((YY-IY)*(IB+dh-IY)+(IB-IY)/2)/(IB-IY);
      int B = *p++;
      if (B >= IB) B += dh;
      else if (B > IY) B = IY+((B-IY)*(IB+dh-IY)+(IB-IY)/2)/(IB-IY);
#else // much simpler code from Francois Ostiguy:
      int XX = *p++;
      if (XX >= IR) XX += dw;
      else if (XX > IX) XX += dw * (XX-IX)/(IR-IX);
      int R = *p++;
      if (R >= IR) R += dw;
      else if (R > IX) R = R + dw * (R-IX)/(IR-IX);

      int YY = *p++;
      if (YY >= IB) YY += dh;
      else if (YY > IY) YY = YY + dh*(YY-IY)/(IB-IY);
      int B = *p++;
      if (B >= IB) B += dh;
      else if (B > IY) B = B + dh*(B-IY)/(IB-IY);
#endif
      o->resize(XX+dx, YY+dy, R-XX, B-YY);
    }
  }
}